

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int mriStep_RKCoeffs(MRIStepCoupling MRIC,int is,int *stage_map,realtype *Ae_row,realtype *Ai_row)

{
  long lVar1;
  uint uVar2;
  realtype ***ppprVar3;
  realtype ***ppprVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  
  iVar5 = -0x29;
  if ((((0 < is) && (Ai_row != (realtype *)0x0)) && (Ae_row != (realtype *)0x0)) &&
     ((stage_map != (int *)0x0 && (uVar2 = MRIC->stages, is < (int)uVar2)))) {
    uVar6 = 0;
    do {
      Ae_row[uVar6] = 0.0;
      Ai_row[uVar6] = 0.0;
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
    iVar5 = MRIC->nmat;
    if ((long)iVar5 < 1) {
      return 0;
    }
    ppprVar3 = MRIC->W;
    ppprVar4 = MRIC->G;
    uVar6 = (ulong)(uint)is;
    lVar7 = 0;
    do {
      lVar1 = lVar7 + 1;
      dVar10 = 1.0 / (double)(int)lVar1;
      if (ppprVar3 != (realtype ***)0x0) {
        uVar8 = 0;
        do {
          lVar9 = (long)stage_map[uVar8];
          if (-1 < lVar9) {
            Ae_row[lVar9] = ppprVar3[lVar7][uVar6][uVar8] * dVar10 + Ae_row[lVar9];
          }
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
      }
      if (ppprVar4 != (realtype ***)0x0) {
        uVar8 = 0;
        do {
          lVar9 = (long)stage_map[uVar8];
          if (-1 < lVar9) {
            Ai_row[lVar9] = ppprVar4[lVar7][uVar6][uVar8] * dVar10 + Ai_row[lVar9];
          }
          uVar8 = uVar8 + 1;
        } while (is + 1 != uVar8);
      }
      lVar7 = lVar1;
    } while (lVar1 != iVar5);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int mriStep_RKCoeffs(MRIStepCoupling MRIC, int is, int *stage_map,
                     realtype *Ae_row, realtype *Ai_row)
{
  int j, k;
  realtype kconst;

  if (is < 1 || is >= MRIC->stages || !stage_map || !Ae_row || !Ai_row)
    return ARK_INVALID_TABLE;

  /* initialize RK coefficient array */
  for (j = 0; j < MRIC->stages; j++) {
    Ae_row[j] = ZERO;
    Ai_row[j] = ZERO;
  }

  /* compute RK coefficients */
  for (k = 0; k < MRIC->nmat; k++) {
    kconst = ONE/(k+ONE);
    if (MRIC->W) {
      for (j = 0; j < is; j++)
        if (stage_map[j] > -1)
          Ae_row[stage_map[j]] += (MRIC->W[k][is][j] * kconst);
    }
    if (MRIC->G) {
      for (j = 0; j <= is; j++)
        if (stage_map[j] > -1)
          Ai_row[stage_map[j]] += (MRIC->G[k][is][j] * kconst);
    }
  }

  return(ARK_SUCCESS);
}